

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

void __thiscall
despot::util::tinyxml::TiXmlDeclaration::Print
          (TiXmlDeclaration *this,FILE *cfile,int param_2,TiXmlString *str)

{
  bool bVar1;
  char *pcVar2;
  TiXmlString *str_local;
  int param_2_local;
  FILE *cfile_local;
  TiXmlDeclaration *this_local;
  
  if (cfile != (FILE *)0x0) {
    fprintf((FILE *)cfile,"<?xml ");
  }
  if (str != (TiXmlString *)0x0) {
    TiXmlString::operator+=(str,"<?xml ");
  }
  bVar1 = TiXmlString::empty(&this->version);
  if (!bVar1) {
    if (cfile != (FILE *)0x0) {
      pcVar2 = TiXmlString::c_str(&this->version);
      fprintf((FILE *)cfile,"version=\"%s\" ",pcVar2);
    }
    if (str != (TiXmlString *)0x0) {
      TiXmlString::operator+=(str,"version=\"");
      TiXmlString::operator+=(str,&this->version);
      TiXmlString::operator+=(str,"\" ");
    }
  }
  bVar1 = TiXmlString::empty(&this->encoding);
  if (!bVar1) {
    if (cfile != (FILE *)0x0) {
      pcVar2 = TiXmlString::c_str(&this->encoding);
      fprintf((FILE *)cfile,"encoding=\"%s\" ",pcVar2);
    }
    if (str != (TiXmlString *)0x0) {
      TiXmlString::operator+=(str,"encoding=\"");
      TiXmlString::operator+=(str,&this->encoding);
      TiXmlString::operator+=(str,"\" ");
    }
  }
  bVar1 = TiXmlString::empty(&this->standalone);
  if (!bVar1) {
    if (cfile != (FILE *)0x0) {
      pcVar2 = TiXmlString::c_str(&this->standalone);
      fprintf((FILE *)cfile,"standalone=\"%s\" ",pcVar2);
    }
    if (str != (TiXmlString *)0x0) {
      TiXmlString::operator+=(str,"standalone=\"");
      TiXmlString::operator+=(str,&this->standalone);
      TiXmlString::operator+=(str,"\" ");
    }
  }
  if (cfile != (FILE *)0x0) {
    fprintf((FILE *)cfile,"?>");
  }
  if (str != (TiXmlString *)0x0) {
    TiXmlString::operator+=(str,"?>");
  }
  return;
}

Assistant:

void TiXmlDeclaration::Print(FILE* cfile, int /*depth*/,
	TIXML_STRING* str) const {
	if (cfile)
		fprintf(cfile, "<?xml ");
	if (str)
		(*str) += "<?xml ";

	if (!version.empty()) {
		if (cfile)
			fprintf(cfile, "version=\"%s\" ", version.c_str());
		if (str) {
			(*str) += "version=\"";
			(*str) += version;
			(*str) += "\" ";
		}
	}
	if (!encoding.empty()) {
		if (cfile)
			fprintf(cfile, "encoding=\"%s\" ", encoding.c_str());
		if (str) {
			(*str) += "encoding=\"";
			(*str) += encoding;
			(*str) += "\" ";
		}
	}
	if (!standalone.empty()) {
		if (cfile)
			fprintf(cfile, "standalone=\"%s\" ", standalone.c_str());
		if (str) {
			(*str) += "standalone=\"";
			(*str) += standalone;
			(*str) += "\" ";
		}
	}
	if (cfile)
		fprintf(cfile, "?>");
	if (str)
		(*str) += "?>";
}